

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_ft_raster.cpp
# Opt level: O3

int gray_raster_render(gray_PRaster raster,SW_FT_Raster_Params *params)

{
  short *psVar1;
  long lVar2;
  TPos TVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  TPos x;
  SW_FT_Vector *pSVar9;
  PCell_conflict pTVar10;
  gray_TBand *band;
  int num_bands;
  int n;
  TPos max;
  TPos min;
  TPos max_y;
  gray_TWorker worker [1];
  gray_TBand bands [40];
  TCell buffer [512];
  long *local_5360;
  int local_5358;
  int local_5354;
  long local_5350;
  long local_5348;
  gray_TWorker_ local_5338;
  long local_42b8;
  long local_42b0;
  PCell_conflict local_4038 [2049];
  
  psVar1 = (short *)params->source;
  if (psVar1 == (short *)0x0) {
    return -1;
  }
  iVar4 = 0;
  if ((psVar1[1] != 0) && (iVar4 = 0, 0 < (long)*psVar1)) {
    if ((*(long *)(psVar1 + 0xc) == 0) || (*(long *)(psVar1 + 4) == 0)) {
      iVar4 = -1;
    }
    else {
      iVar4 = -1;
      if (*(short *)(*(long *)(psVar1 + 0xc) + -2 + (long)*psVar1 * 2) + 1 == (int)psVar1[1]) {
        iVar4 = -2;
        if ((params->flags & 1U) != 0) {
          if ((params->flags & 4U) == 0) {
            local_5338.clip_box.xMin = -0x8000;
            local_5338.clip_box.yMin = -0x8000;
            local_5338.clip_box.xMax = 0x7fff;
            local_5338.clip_box.yMax = 0x7fff;
          }
          else {
            local_5338.clip_box.xMin = (params->clip_box).xMin;
            local_5338.clip_box.yMin = (params->clip_box).yMin;
            local_5338.clip_box.xMax = (params->clip_box).xMax;
            local_5338.clip_box.yMax = (params->clip_box).yMax;
          }
          local_5338.buffer = local_4038;
          local_5338.buffer_size = 0x4000;
          local_5338.area = 0;
          local_5338.cover = 0;
          local_5338.cells = (PCell_conflict)0x0;
          local_5338.max_cells = 0;
          local_5338.num_cells = 0;
          local_5338.bound_left = 0x7fffffff;
          local_5338.bound_top = 0x7fffffff;
          local_5338.bound_right = -0x80000000;
          local_5338.bound_bottom = -0x80000000;
          local_5338.outline.n_contours = psVar1[0];
          local_5338.outline.n_points = psVar1[1];
          local_5338.outline._4_2_ = psVar1[2];
          local_5338.outline._6_2_ = psVar1[3];
          local_5338.outline.points = *(SW_FT_Vector **)(psVar1 + 4);
          local_5338.outline.tags = *(char **)(psVar1 + 8);
          local_5338.outline.contours = *(short **)(psVar1 + 0xc);
          local_5338.outline.contours_flag = *(char **)(psVar1 + 0x10);
          local_5338.outline._40_8_ = *(undefined8 *)(psVar1 + 0x14);
          local_5338.invalid = 1;
          local_5338.band_size = 0x40;
          local_5338.num_gray_spans = 0;
          local_5338.render_span = params->gray_spans;
          local_5338.render_span_data = params->user;
          if ((long)local_5338.outline.n_points < 1) {
            local_5338.min_ey = 0;
            local_5338.max_ey = 0;
            local_5338.min_ex = 0;
            local_5338.max_ex = 0;
          }
          else {
            lVar5 = (local_5338.outline.points)->x;
            lVar7 = (local_5338.outline.points)->y;
            local_5338.min_ey = lVar7;
            local_5338.min_ex = lVar5;
            if (local_5338.outline.n_points != 1) {
              pSVar9 = local_5338.outline.points + 1;
              do {
                lVar8 = pSVar9->x;
                if (lVar8 < local_5338.min_ex) {
                  local_5338.min_ex = lVar8;
                }
                lVar2 = pSVar9->y;
                if (lVar5 < lVar8) {
                  lVar5 = lVar8;
                }
                if (lVar2 < local_5338.min_ey) {
                  local_5338.min_ey = lVar2;
                }
                if (lVar7 < lVar2) {
                  lVar7 = lVar2;
                }
                pSVar9 = pSVar9 + 1;
              } while (pSVar9 < local_5338.outline.points + local_5338.outline.n_points);
            }
            local_5338.min_ex = local_5338.min_ex >> 6;
            local_5338.min_ey = local_5338.min_ey >> 6;
            local_5338.max_ex = lVar5 + 0x3f >> 6;
            local_5338.max_ey = lVar7 + 0x3f >> 6;
          }
          local_5338.ycells = (PCell_conflict *)local_5338.buffer;
          if ((((local_5338.clip_box.xMin < local_5338.max_ex) &&
               (local_5338.min_ex < local_5338.clip_box.xMax)) &&
              (local_5338.clip_box.yMin < local_5338.max_ey)) &&
             (local_5338.min_ey < local_5338.clip_box.yMax)) {
            if (local_5338.min_ex < local_5338.clip_box.xMin) {
              local_5338.min_ex = local_5338.clip_box.xMin;
            }
            if (local_5338.min_ey < local_5338.clip_box.yMin) {
              local_5338.min_ey = local_5338.clip_box.yMin;
            }
            if (local_5338.clip_box.xMax < local_5338.max_ex) {
              local_5338.max_ex = local_5338.clip_box.xMax;
            }
            if (local_5338.clip_box.yMax < local_5338.max_ey) {
              local_5338.max_ey = local_5338.clip_box.yMax;
            }
            TVar3 = local_5338.max_ey;
            local_5338.count_ex = local_5338.max_ex - local_5338.min_ex;
            local_5338.count_ey = local_5338.max_ey - local_5338.min_ey;
            uVar6 = local_5338.count_ey + 0x3f;
            if (-1 < local_5338.count_ey) {
              uVar6 = local_5338.count_ey;
            }
            local_5358 = (int)(uVar6 >> 6);
            if (local_5358 == 0) {
              local_5358 = 1;
            }
            if (0x26 < local_5358) {
              local_5358 = 0x27;
            }
            local_5338.band_shoot = 0;
            local_5354 = 0;
            if (0 < local_5358) {
              local_5348 = local_5338.min_ey;
              do {
                local_5360 = &local_42b8;
                if ((local_5354 == local_5358 + -1) ||
                   (local_5350 = local_5338.band_size + local_5348,
                   TVar3 < local_5338.band_size + local_5348)) {
                  local_5350 = TVar3;
                }
                local_42b8 = local_5348;
                local_42b0 = local_5350;
                while (&local_42b8 <= local_5360) {
                  local_5338.ycells = (PCell_conflict *)local_5338.buffer;
                  local_5338.ycount = local_5360[1] - *local_5360;
                  uVar6 = (local_5338.ycount * 8 & 0xffffffffffffffe0U) + 0x20;
                  if ((local_5338.ycount & 3U) == 0) {
                    uVar6 = local_5338.ycount * 8;
                  }
                  local_5338.cells = (PCell_conflict)((long)local_5338.buffer + uVar6);
                  lVar5 = (local_5338.buffer_size & 0xffffffffffffffe0U) - uVar6;
                  if ((lVar5 == 0 ||
                       (long)(local_5338.buffer_size & 0xffffffffffffffe0U) < (long)uVar6) ||
                     (local_5338.max_cells = lVar5 >> 5, local_5338.max_cells < 2)) {
LAB_001095b2:
                    lVar5 = *local_5360;
                    lVar7 = local_5360[1];
                    if ((ulong)(lVar7 - lVar5) < 2) goto LAB_0010965c;
                    if ((long)local_5338.band_size <= lVar5 - lVar7) {
                      local_5338.band_shoot = local_5338.band_shoot + 1;
                    }
                    lVar8 = (lVar7 - lVar5 >> 1) + lVar5;
                    local_5360[2] = lVar5;
                    local_5360[3] = lVar8;
                    *local_5360 = lVar8;
                    local_5360[1] = lVar7;
                    local_5360 = local_5360 + 2;
                  }
                  else {
                    if (0 < local_5338.ycount) {
                      uVar6 = 0;
                      do {
                        *(PCell_conflict *)((long)local_5338.buffer + uVar6 * 8) =
                             (PCell_conflict)0x0;
                        uVar6 = uVar6 + 1;
                      } while (local_5338.ycount != uVar6);
                    }
                    local_5338.num_cells = 0;
                    local_5338.invalid = 1;
                    local_5338.min_ey = *local_5360;
                    local_5338.max_ey = local_5360[1];
                    local_5338.count_ey = local_5360[1] - *local_5360;
                    iVar4 = gray_convert_glyph_inner(&local_5338);
                    if (iVar4 == -4) goto LAB_001095b2;
                    if (iVar4 != 0) goto LAB_0010965c;
                    if (local_5338.num_cells != 0) {
                      local_5338.num_gray_spans = 0;
                      if (0 < local_5338.ycount) {
                        lVar5 = 0;
                        do {
                          pTVar10 = local_5338.ycells[lVar5];
                          if (pTVar10 != (PCell_conflict)0x0) {
                            lVar7 = 0;
                            lVar8 = 0;
                            do {
                              x = pTVar10->x;
                              if ((lVar8 != 0) && (x - lVar7 != 0 && lVar7 <= x)) {
                                gray_hline(&local_5338,lVar7,lVar5,lVar8 << 9,x - lVar7);
                                x = pTVar10->x;
                              }
                              lVar8 = lVar8 + pTVar10->cover;
                              lVar7 = lVar8 * 0x200 - (long)pTVar10->area;
                              if (-1 < x && lVar7 != 0) {
                                gray_hline(&local_5338,x,lVar5,lVar7,1);
                                x = pTVar10->x;
                              }
                              lVar7 = x + 1;
                              pTVar10 = pTVar10->next;
                            } while (pTVar10 != (PCell)0x0);
                            if (lVar8 != 0) {
                              gray_hline(&local_5338,lVar7,lVar5,lVar8 * 0x200,
                                         local_5338.count_ex - lVar7);
                            }
                          }
                          lVar5 = lVar5 + 1;
                        } while (lVar5 < local_5338.ycount);
                      }
                      if ((local_5338.render_span != (SW_FT_SpanFunc)0x0) &&
                         (0 < local_5338.num_gray_spans)) {
                        (*local_5338.render_span)
                                  (local_5338.num_gray_spans,local_5338.gray_spans,
                                   local_5338.render_span_data);
                      }
                    }
                    local_5360 = local_5360 + -2;
                  }
                }
                local_5354 = local_5354 + 1;
                local_5348 = local_5350;
              } while (local_5354 < local_5358);
              if ((8 < local_5338.band_shoot) && (0x10 < local_5338.band_size)) {
                local_5338.band_size = (uint)local_5338.band_size >> 1;
              }
            }
          }
LAB_0010965c:
          (*params->bbox_cb)(local_5338.bound_left,local_5338.bound_top,
                             local_5338.bound_right - local_5338.bound_left,
                             (local_5338.bound_bottom - local_5338.bound_top) + 1,params->user);
          iVar4 = 1;
        }
      }
    }
  }
  return iVar4;
}

Assistant:

static int gray_raster_render(gray_PRaster               raster,
                              const SW_FT_Raster_Params* params)
{
    SW_FT_UNUSED(raster);
    const SW_FT_Outline* outline = (const SW_FT_Outline*)params->source;

    gray_TWorker worker[1];

    TCell buffer[SW_FT_RENDER_POOL_SIZE / sizeof(TCell)];
    long  buffer_size = sizeof(buffer);
    int   band_size = (int)(buffer_size / (long)(sizeof(TCell) * 8));

    if (!outline) return SW_FT_THROW(Invalid_Outline);

    /* return immediately if the outline is empty */
    if (outline->n_points == 0 || outline->n_contours <= 0) return 0;

    if (!outline->contours || !outline->points)
        return SW_FT_THROW(Invalid_Outline);

    if (outline->n_points != outline->contours[outline->n_contours - 1] + 1)
        return SW_FT_THROW(Invalid_Outline);

    /* this version does not support monochrome rendering */
    if (!(params->flags & SW_FT_RASTER_FLAG_AA))
        return SW_FT_THROW(Invalid_Mode);

    if (params->flags & SW_FT_RASTER_FLAG_CLIP)
        ras.clip_box = params->clip_box;
    else {
        ras.clip_box.xMin = -32768L;
        ras.clip_box.yMin = -32768L;
        ras.clip_box.xMax = 32767L;
        ras.clip_box.yMax = 32767L;
    }

    gray_init_cells(RAS_VAR_ buffer, buffer_size);

    ras.outline = *outline;
    ras.num_cells = 0;
    ras.invalid = 1;
    ras.band_size = band_size;
    ras.num_gray_spans = 0;

    ras.render_span = (SW_FT_Raster_Span_Func)params->gray_spans;
    ras.render_span_data = params->user;

    gray_convert_glyph(RAS_VAR);
    params->bbox_cb(ras.bound_left, ras.bound_top,
                    ras.bound_right - ras.bound_left,
                    ras.bound_bottom - ras.bound_top + 1, params->user);
    return 1;
}